

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

bool __thiscall AActor::IsInsideVisibleAngles(AActor *this)

{
  double dVar1;
  AActor *pAVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 local_48 [16];
  double local_38;
  double dStack_30;
  double local_28;
  
  bVar3 = true;
  if (((this->renderflags).Value & 0x200000) != 0) {
    pAVar2 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
    if (pAVar2 != (AActor *)0x0) {
      dVar5 = (this->VisibleEndAngle).Degrees;
      dVar6 = (this->VisibleStartAngle).Degrees;
      dVar7 = (this->VisibleStartPitch).Degrees;
      dVar1 = (this->VisibleEndPitch).Degrees;
      pAVar2 = GC::ReadBarrier<AActor>((AActor **)(&DAT_017dc0f8 + (long)consoleplayer * 0x54));
      if (pAVar2 != (AActor *)0x0) {
        dVar4 = dVar5;
        if (dVar6 <= dVar5) {
          dVar4 = dVar6;
        }
        local_28 = ViewPos.Z - (this->__Pos).Z;
        local_38 = ViewPos.X - (this->__Pos).X;
        dStack_30 = ViewPos.Y - (this->__Pos).Y;
        TVector3<double>::Angle((TVector3<double> *)local_48);
        if (((this->renderflags).Value & 0x400000) == 0) {
          local_48._0_8_ =
               (double)SUB84(((double)local_48._0_8_ - (this->Angles).Yaw.Degrees) *
                             11930464.711111112 + 6755399441055744.0,0) * 8.381903171539307e-08;
        }
        bVar3 = false;
        if (dVar4 <= (double)local_48._0_8_) {
          if (dVar6 <= dVar5) {
            dVar6 = dVar5;
          }
          bVar3 = false;
          if ((double)local_48._0_8_ <= dVar6) {
            dVar5 = dVar1;
            if (dVar7 <= dVar1) {
              dVar5 = dVar7;
            }
            TVector3<double>::Pitch((TVector3<double> *)(local_48 + 8));
            if (((this->renderflags).Value & 0x800000) == 0) {
              local_48._8_8_ =
                   (double)SUB84(((double)local_48._8_8_ - (this->Angles).Pitch.Degrees) *
                                 11930464.711111112 + 6755399441055744.0,0) * 8.381903171539307e-08;
            }
            if (dVar5 <= (double)local_48._8_8_) {
              if (dVar7 <= dVar1) {
                dVar7 = dVar1;
              }
              bVar3 = (double)local_48._8_8_ <= dVar7;
            }
            else {
              bVar3 = false;
            }
          }
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool AActor::IsInsideVisibleAngles() const
{
	// Don't bother masking if not wanted.
	if (!(renderflags & RF_MASKROTATION))
		return true;

	if (players[consoleplayer].camera == nullptr)
		return true;
	
	DAngle anglestart = VisibleStartAngle;
	DAngle angleend = VisibleEndAngle;
	DAngle pitchstart = VisibleStartPitch;
	DAngle pitchend = VisibleEndPitch;
	
	if (anglestart > angleend)
	{
		DAngle temp = anglestart;
		anglestart = angleend;
		angleend = temp;
	}

	if (pitchstart > pitchend)
	{
		DAngle temp = pitchstart;
		pitchstart = pitchend;
		pitchend = temp;
	}
	

	AActor *mo = players[consoleplayer].camera;

	if (mo != nullptr)
	{
		
		DVector3 diffang = ViewPos - Pos();
		DAngle to = diffang.Angle();

		if (!(renderflags & RF_ABSMASKANGLE)) 
			to = deltaangle(Angles.Yaw, to);

		if ((to >= anglestart && to <= angleend))
		{
			to = diffang.Pitch();
			if (!(renderflags & RF_ABSMASKPITCH))
				to = deltaangle(Angles.Pitch, to);

			return !!(to >= pitchstart && to <= pitchend);
		}
		else return false;
	}
	return true;
}